

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinstats.cpp
# Opt level: O0

uint64_t kernel::GetBogoSize(CScript *script_pub_key)

{
  size_type sVar1;
  long in_FS_OFFSET;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *this;
  
  this = *(prevector<28U,_unsigned_char,_unsigned_int,_int> **)(in_FS_OFFSET + 0x28);
  sVar1 = prevector<28U,_unsigned_char,_unsigned_int,_int>::size(this);
  if (*(prevector<28U,_unsigned_char,_unsigned_int,_int> **)(in_FS_OFFSET + 0x28) == this) {
    return (ulong)(sVar1 + 0x32);
  }
  __stack_chk_fail();
}

Assistant:

uint64_t GetBogoSize(const CScript& script_pub_key)
{
    return 32 /* txid */ +
           4 /* vout index */ +
           4 /* height + coinbase */ +
           8 /* amount */ +
           2 /* scriptPubKey len */ +
           script_pub_key.size() /* scriptPubKey */;
}